

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_buf_iter(uv_fs_t *req,uv__fs_buf_iter_processor process)

{
  uv_buf_t *ptr;
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  ssize_t result;
  ssize_t total;
  uv_buf_t *bufs;
  uint nbufs;
  uint iovmax;
  uv__fs_buf_iter_processor process_local;
  uv_fs_t *req_local;
  
  uVar1 = uv__getiovmax();
  bufs._0_4_ = req->nbufs;
  ptr = req->bufs;
  result = 0;
  do {
    if ((uint)bufs == 0) {
LAB_00a0e8f1:
      piVar3 = __errno_location();
      if ((*piVar3 != 4) || (result != -1)) {
        if (ptr != req->bufsml) {
          uv__free(ptr);
        }
        req->bufs = (uv_buf_t *)0x0;
        req->nbufs = 0;
      }
      return result;
    }
    req->nbufs = (uint)bufs;
    if (uVar1 < req->nbufs) {
      req->nbufs = uVar1;
    }
    sVar2 = (*process)(req);
    if (sVar2 < 1) {
      if (result == 0) {
        result = sVar2;
      }
      goto LAB_00a0e8f1;
    }
    if (-1 < req->off) {
      req->off = sVar2 + req->off;
    }
    req->bufs = req->bufs + req->nbufs;
    bufs._0_4_ = (uint)bufs - req->nbufs;
    result = sVar2 + result;
  } while( true );
}

Assistant:

static ssize_t uv__fs_buf_iter(uv_fs_t* req, uv__fs_buf_iter_processor process) {
  unsigned int iovmax;
  unsigned int nbufs;
  uv_buf_t* bufs;
  ssize_t total;
  ssize_t result;

  iovmax = uv__getiovmax();
  nbufs = req->nbufs;
  bufs = req->bufs;
  total = 0;

  while (nbufs > 0) {
    req->nbufs = nbufs;
    if (req->nbufs > iovmax)
      req->nbufs = iovmax;

    result = process(req);
    if (result <= 0) {
      if (total == 0)
        total = result;
      break;
    }

    if (req->off >= 0)
      req->off += result;

    req->bufs += req->nbufs;
    nbufs -= req->nbufs;
    total += result;
  }

  if (errno == EINTR && total == -1)
    return total;

  if (bufs != req->bufsml)
    uv__free(bufs);

  req->bufs = NULL;
  req->nbufs = 0;

  return total;
}